

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (nextarg == (char *)0x0) {
    return;
  }
  sVar3 = strlen(nextarg);
  if (sVar3 == 0) {
LAB_00112964:
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar2 == 0) && (pcVar4 = strpbrk(nextarg,":\\"), pcVar4 != (char *)0x0)) {
      pcVar4 = (char *)malloc(sVar3 + 1);
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar4;
        if (*nextarg == '\0') {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (char *)0x0;
          do {
            sVar3 = strcspn(nextarg,":\\");
            memcpy(pcVar7,nextarg,sVar3);
            pcVar6 = nextarg + sVar3;
            pcVar7 = pcVar7 + sVar3;
            if (nextarg[sVar3] == '\\') {
              cVar1 = pcVar6[1];
              if (cVar1 == '\\') {
                *pcVar7 = '\\';
              }
              else {
                if (cVar1 != ':') {
                  if (cVar1 == '\0') {
                    pcVar6 = pcVar6 + 1;
                    *pcVar7 = '\\';
                    pcVar7 = pcVar7 + 1;
                  }
                  else {
                    *pcVar7 = '\\';
                    pcVar7[1] = cVar1;
                    pcVar7 = pcVar7 + 2;
                    pcVar6 = pcVar6 + 2;
                  }
                  goto LAB_0011294b;
                }
                *pcVar7 = ':';
              }
              pcVar6 = pcVar6 + 2;
              pcVar7 = pcVar7 + 1;
            }
            else if (nextarg[sVar3] == ':') {
              if (pcVar6[1] == '\0') {
                pcVar5 = (char *)0x0;
              }
              else {
                pcVar5 = strdup(pcVar6 + 1);
              }
              break;
            }
LAB_0011294b:
            nextarg = pcVar6;
          } while (*pcVar6 != '\0');
        }
        *pcVar7 = '\0';
        goto LAB_0011296e;
      }
      goto LAB_00112964;
    }
    pcVar4 = strdup(nextarg);
  }
  pcVar5 = (char *)0x0;
LAB_0011296e:
  free(*file);
  *file = pcVar4;
  if (pcVar5 != (char *)0x0) {
    free(*password);
    *password = pcVar5;
  }
  return;
}

Assistant:

static void
GetFileAndPassword(const char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  if(nextarg) {
    parse_cert_parameter(nextarg, &certname, &passphrase);
    free(*file);
    *file = certname;
    if(passphrase) {
      free(*password);
      *password = passphrase;
    }
  }
}